

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O1

void __thiscall
FastPForLib::FastPForTest::_genDataWithFixBits
          (FastPForTest *this,vector<int,_std::allocator<int>_> *v,uint32_t bits,uint32_t values)

{
  pointer piVar1;
  iterator __position;
  result_type_conflict2 rVar2;
  long lVar3;
  unsigned_long uVar4;
  ulong uVar5;
  uniform_int_distribution<unsigned_int> dist;
  mt19937_64 e2;
  uint local_a04;
  uniform_int_distribution<unsigned_int> local_a00;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  local_9f8._M_x[0] = 0x1e240;
  lVar3 = 1;
  uVar4 = 0x1e240;
  do {
    uVar4 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d + lVar3;
    local_9f8._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  local_9f8._M_p = 0x138;
  local_a00._M_param._M_b = ~(-1 << (bits & 0x1f));
  if (bits == 0x20) {
    local_a00._M_param._M_b = 0xffffffff;
  }
  local_a00._M_param._M_a = 0;
  if (values != 0) {
    uVar5 = (ulong)values;
    do {
      rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                        (&local_a00,&local_9f8,&local_a00._M_param);
      local_a04 = rVar2 | 1 << ((byte)((char)bits - 1) & 0x1f);
      __position._M_current =
           (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (v,__position,(int *)&local_a04);
      }
      else {
        *__position._M_current = local_a04;
        (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
             = __position._M_current + 1;
      }
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void _genDataWithFixBits(
                                 std::vector<int32_t>& v,
                                 uint32_t bits,
                                 uint32_t values) {
          v.clear();
          std::mt19937_64 e2(123456);
          std::uniform_int_distribution<uint32_t> dist(
                                  0,
                                  bits == 32 ? ~0U : (1U << bits) - 1);
          for (size_t i = 0; i < values; ++i) {
            v.push_back(static_cast<int32_t>(dist(e2) | 1U << (bits - 1)));
          }
        }